

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O1

void Saig_ManCexMinCollectFrameTerms_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vFrameCisOne)

{
  uint uVar1;
  uint uVar2;
  
  while( true ) {
    while( true ) {
      if (pObj->TravId == pAig->nTravIds) {
        return;
      }
      pObj->TravId = pAig->nTravIds;
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar1 = uVar2 & 7;
      if (uVar1 != 3) break;
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    }
    if ((uVar2 & 7) - 7 < 0xfffffffe) break;
    Saig_ManCexMinCollectFrameTerms_rec
              (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vFrameCisOne);
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  if (uVar1 != 2) {
    return;
  }
  Vec_IntPush(vFrameCisOne,pObj->Id);
  return;
}

Assistant:

void Saig_ManCexMinCollectFrameTerms_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vFrameCisOne )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin0(pObj), vFrameCisOne );
    else if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin0(pObj), vFrameCisOne );
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin1(pObj), vFrameCisOne );
    }
    else if ( Aig_ObjIsCi(pObj) )
        Vec_IntPush( vFrameCisOne, Aig_ObjId(pObj) );
}